

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
stringToUnits_withSpace_Test::~stringToUnits_withSpace_Test(stringToUnits_withSpace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, withSpace)
{
    EXPECT_EQ(precise::m.inv(), unit_from_string("1 /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1  /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   / m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /  m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1   /   m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1/   m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1\t/          m"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1\t/\tm"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("1/\tm"));
    EXPECT_EQ(precise::m.inv(), unit_from_string("  1/\tm  "));
}